

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O0

uint32_t quicly_cc_calc_initial_cwnd(uint32_t max_packets,uint16_t max_udp_payload_size)

{
  uint16_t max_udp_payload_size_local;
  uint32_t max_packets_local;
  
  max_packets_local = max_packets;
  if (max_packets < 2) {
    max_packets_local = 2;
  }
  max_udp_payload_size_local = max_udp_payload_size;
  if (0x5c0 < max_udp_payload_size) {
    max_udp_payload_size_local = 0x5c0;
  }
  return max_packets_local * max_udp_payload_size_local;
}

Assistant:

uint32_t quicly_cc_calc_initial_cwnd(uint32_t max_packets, uint16_t max_udp_payload_size)
{
    static const uint32_t mtu_max = 1472;

    /* apply filters to the two arguments */
    if (max_packets < QUICLY_MIN_CWND)
        max_packets = QUICLY_MIN_CWND;
    if (max_udp_payload_size > mtu_max)
        max_udp_payload_size = mtu_max;

    return max_packets * max_udp_payload_size;
}